

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArrayIndexEnumerator.cpp
# Opt level: O1

void __thiscall
Js::JavascriptArrayIndexEnumerator::JavascriptArrayIndexEnumerator
          (JavascriptArrayIndexEnumerator *this,JavascriptArray *arrayObject,EnumeratorFlags flags,
          ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  
  JavascriptArrayIndexEnumeratorBase::JavascriptArrayIndexEnumeratorBase
            (&this->super_JavascriptArrayIndexEnumeratorBase,arrayObject,flags,scriptContext);
  (this->super_JavascriptArrayIndexEnumeratorBase).super_JavascriptEnumerator.super_RecyclableObject
  .super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0150df20;
  if (arrayObject != (JavascriptArray *)0x0) {
    bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(arrayObject);
    if (bVar1) {
      this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(arrayObject);
    }
    else {
      this_00 = (JavascriptCopyOnAccessNativeIntArray *)0x0;
    }
    if (this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
    }
  }
  (*(this->super_JavascriptArrayIndexEnumeratorBase).super_JavascriptEnumerator.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x62])(this);
  return;
}

Assistant:

JavascriptArrayIndexEnumerator::JavascriptArrayIndexEnumerator(
        JavascriptArray* arrayObject, EnumeratorFlags flags, ScriptContext* scriptContext) :
        JavascriptArrayIndexEnumeratorBase(arrayObject, flags, scriptContext)
    {
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arrayObject);
#endif
        Reset();
    }